

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O1

void __thiscall QOpenGLTexturePrivate::allocateImmutableStorage(QOpenGLTexturePrivate *this)

{
  Target TVar1;
  int iVar2;
  code *pcVar3;
  BindingTarget BVar4;
  GLuint GVar5;
  QOpenGLTextureHelper *pQVar6;
  long *plVar7;
  int iVar8;
  TextureFormat TVar9;
  int iVar10;
  uint uVar11;
  
  TVar1 = this->target;
  if ((int)TVar1 < 0x8c18) {
    if ((int)TVar1 < 0x806f) {
      if (TVar1 == Target1D) {
        if (((this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
             super_QFlagsStorage<QOpenGLTexture::Feature>.i & 0x2000) == 0) {
          allocateImmutableStorage();
          return;
        }
        pQVar6 = this->texFuncs;
        pcVar3 = (code *)pQVar6->TextureStorage1D;
        plVar7 = (long *)((long)&pQVar6->functions + *(long *)&pQVar6->field_0x80);
        if (((ulong)pcVar3 & 1) != 0) {
          pcVar3 = *(code **)(pcVar3 + *plVar7 + -1);
        }
        (*pcVar3)(plVar7,this->textureId,0xde0,this->bindingTarget,this->mipLevels,this->format,
                  this->dimensions[0]);
        goto LAB_00154fae;
      }
      if (TVar1 != Target2D) goto LAB_00154fae;
    }
    else {
      if (TVar1 == Target3D) {
        if (((this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
             super_QFlagsStorage<QOpenGLTexture::Feature>.i & 0x10) == 0) {
          allocateImmutableStorage();
          return;
        }
        pQVar6 = this->texFuncs;
        BVar4 = this->bindingTarget;
        GVar5 = this->textureId;
        iVar8 = this->mipLevels;
        TVar9 = this->format;
        iVar2 = this->dimensions[0];
        iVar10 = this->dimensions[1];
        uVar11 = this->dimensions[2];
        goto LAB_00154f88;
      }
      if ((TVar1 != TargetRectangle) && (TVar1 != TargetCubeMap)) goto LAB_00154fae;
    }
    pQVar6 = this->texFuncs;
    BVar4 = this->bindingTarget;
    GVar5 = this->textureId;
    iVar8 = this->mipLevels;
    TVar9 = this->format;
    iVar2 = this->dimensions[0];
    iVar10 = this->dimensions[1];
LAB_00154f39:
    pcVar3 = (code *)pQVar6->TextureStorage2D;
    plVar7 = (long *)((long)&pQVar6->functions + *(long *)&pQVar6->field_0x70);
    if (((ulong)pcVar3 & 1) != 0) {
      pcVar3 = *(code **)(pcVar3 + *plVar7 + -1);
    }
    (*pcVar3)(plVar7,GVar5,TVar1,BVar4,iVar8,TVar9,iVar2,iVar10);
  }
  else {
    if ((int)TVar1 < 0x9009) {
      if (TVar1 == Target1DArray) {
        if ((~(this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
              super_QFlagsStorage<QOpenGLTexture::Feature>.i & 0x2008) != 0) {
          allocateImmutableStorage();
          return;
        }
        pQVar6 = this->texFuncs;
        BVar4 = this->bindingTarget;
        GVar5 = this->textureId;
        iVar8 = this->mipLevels;
        TVar9 = this->format;
        iVar2 = this->dimensions[0];
        iVar10 = this->layers;
        goto LAB_00154f39;
      }
      if (TVar1 != Target2DArray) {
        if (TVar1 == TargetBuffer) {
          allocateImmutableStorage();
          return;
        }
        goto LAB_00154fae;
      }
      if (((this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
           super_QFlagsStorage<QOpenGLTexture::Feature>.i & 8) == 0) {
        allocateImmutableStorage();
        return;
      }
      pQVar6 = this->texFuncs;
      BVar4 = this->bindingTarget;
      GVar5 = this->textureId;
      iVar8 = this->mipLevels;
      TVar9 = this->format;
      iVar2 = this->dimensions[0];
      iVar10 = this->dimensions[1];
      uVar11 = this->layers;
LAB_00154f88:
      pcVar3 = (code *)pQVar6->TextureStorage3D;
      plVar7 = (long *)((long)&pQVar6->functions + *(long *)&pQVar6->field_0x60);
      if (((ulong)pcVar3 & 1) != 0) {
        pcVar3 = *(code **)(pcVar3 + *plVar7 + -1);
      }
    }
    else {
      if (TVar1 == TargetCubeMapArray) {
        if (((this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
             super_QFlagsStorage<QOpenGLTexture::Feature>.i & 0x80) == 0) {
          allocateImmutableStorage();
          return;
        }
        pQVar6 = this->texFuncs;
        pcVar3 = (code *)pQVar6->TextureStorage3D;
        plVar7 = (long *)((long)&pQVar6->functions + *(long *)&pQVar6->field_0x60);
        if (((ulong)pcVar3 & 1) != 0) {
          pcVar3 = *(code **)(pcVar3 + *plVar7 + -1);
        }
        (*pcVar3)(plVar7,this->textureId,0x9009,this->bindingTarget,this->mipLevels,this->format,
                  this->dimensions[0],this->dimensions[1],this->layers * 6);
        goto LAB_00154fae;
      }
      if (TVar1 == Target2DMultisample) {
        if (((this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
             super_QFlagsStorage<QOpenGLTexture::Feature>.i & 2) == 0) {
          allocateImmutableStorage();
          return;
        }
        pQVar6 = this->texFuncs;
        BVar4 = this->bindingTarget;
        GVar5 = this->textureId;
        iVar8 = this->samples;
        TVar9 = this->format;
        iVar2 = this->dimensions[0];
        iVar10 = this->dimensions[1];
        pcVar3 = (code *)pQVar6->TextureStorage2DMultisample;
        plVar7 = (long *)((long)&pQVar6->functions + *(long *)&pQVar6->field_0xa0);
        if (((ulong)pcVar3 & 1) != 0) {
          pcVar3 = *(code **)(pcVar3 + *plVar7 + -1);
        }
        uVar11 = (uint)this->fixedSamplePositions;
      }
      else {
        if (TVar1 != Target2DMultisampleArray) goto LAB_00154fae;
        if ((~(this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
              super_QFlagsStorage<QOpenGLTexture::Feature>.i & 10) != 0) {
          allocateImmutableStorage();
          return;
        }
        pQVar6 = this->texFuncs;
        BVar4 = this->bindingTarget;
        GVar5 = this->textureId;
        iVar8 = this->samples;
        TVar9 = this->format;
        iVar2 = this->dimensions[0];
        iVar10 = this->dimensions[1];
        uVar11 = this->layers;
        pcVar3 = (code *)pQVar6->TextureStorage3DMultisample;
        plVar7 = (long *)((long)&pQVar6->functions + *(long *)&pQVar6->field_0x90);
        if (((ulong)pcVar3 & 1) != 0) {
          pcVar3 = *(code **)(pcVar3 + *plVar7 + -1);
        }
      }
    }
    (*pcVar3)(plVar7,GVar5,TVar1,BVar4,iVar8,TVar9,iVar2,iVar10,uVar11);
  }
LAB_00154fae:
  this->storageAllocated = true;
  return;
}

Assistant:

void QOpenGLTexturePrivate::allocateImmutableStorage()
{
    switch (target) {
    case QOpenGLTexture::TargetBuffer:
        // Buffer textures get their storage from an external OpenGL buffer
        qWarning("Buffer textures do not allocate storage");
        return;

    case QOpenGLTexture::Target1D:
        if (features.testFlag(QOpenGLTexture::Texture1D)) {
            texFuncs->glTextureStorage1D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0]);
        } else {
            qWarning("1D textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target1DArray:
        if (features.testFlag(QOpenGLTexture::Texture1D)
                && features.testFlag(QOpenGLTexture::TextureArrays)) {
            texFuncs->glTextureStorage2D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0], layers);
        } else {
            qWarning("1D array textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target2D:
    case QOpenGLTexture::TargetCubeMap:
    case QOpenGLTexture::TargetRectangle:
        texFuncs->glTextureStorage2D(textureId, target, bindingTarget, mipLevels, format,
                                     dimensions[0], dimensions[1]);
        break;

    case QOpenGLTexture::Target2DArray:
        if (features.testFlag(QOpenGLTexture::TextureArrays)) {
            texFuncs->glTextureStorage3D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0], dimensions[1], layers);
        } else {
            qWarning("Array textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::TargetCubeMapArray:
        // Cubemap arrays must specify number of layer-faces (6 * layers) as depth parameter
        if (features.testFlag(QOpenGLTexture::TextureCubeMapArrays)) {
            texFuncs->glTextureStorage3D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0], dimensions[1], 6 * layers);
        } else {
            qWarning("Cubemap Array textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target3D:
        if (features.testFlag(QOpenGLTexture::Texture3D)) {
            texFuncs->glTextureStorage3D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0], dimensions[1], dimensions[2]);
        } else {
            qWarning("3D textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target2DMultisample:
        if (features.testFlag(QOpenGLTexture::ImmutableMultisampleStorage)) {
            texFuncs->glTextureStorage2DMultisample(textureId, target, bindingTarget, samples, format,
                                                    dimensions[0], dimensions[1],
                                                    fixedSamplePositions);
        } else {
            qWarning("Multisample textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target2DMultisampleArray:
        if (features.testFlag(QOpenGLTexture::ImmutableMultisampleStorage)
                && features.testFlag(QOpenGLTexture::TextureArrays)) {
            texFuncs->glTextureStorage3DMultisample(textureId, target, bindingTarget, samples, format,
                                                    dimensions[0], dimensions[1], layers,
                                                    fixedSamplePositions);
        } else {
            qWarning("Multisample array textures are not supported");
            return;
        }
        break;
    }

    storageAllocated = true;
}